

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Text __thiscall loguru::ec_to_text(loguru *this,EcHandle ec_handle)

{
  char *pcVar1;
  size_t sVar2;
  char *__src;
  char *with_newline;
  size_t buffer_size;
  Text parent_ec;
  EcHandle ec_handle_local;
  
  parent_ec._str = (char *)ec_handle;
  get_error_context_for((loguru *)&buffer_size,ec_handle);
  pcVar1 = Text::c_str((Text *)&buffer_size);
  sVar2 = strlen(pcVar1);
  pcVar1 = (char *)malloc(sVar2 + 2);
  *pcVar1 = '\n';
  __src = Text::c_str((Text *)&buffer_size);
  strcpy(pcVar1 + 1,__src);
  Text::Text((Text *)this,pcVar1);
  Text::~Text((Text *)&buffer_size);
  return (Text)(char *)this;
}

Assistant:

Text ec_to_text(EcHandle ec_handle)
	{
		Text parent_ec = get_error_context_for(ec_handle);
		size_t buffer_size = strlen(parent_ec.c_str()) + 2;
		char* with_newline = reinterpret_cast<char*>(malloc(buffer_size));
		with_newline[0] = '\n';
	#ifdef _WIN32
		strncpy_s(with_newline + 1, buffer_size, parent_ec.c_str(), buffer_size - 2);
	#else
		strcpy(with_newline + 1, parent_ec.c_str());
	#endif
		return Text(with_newline);
	}